

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspec.c
# Opt level: O0

void apet_walk_to_room(CHAR_DATA *ch,int vnum)

{
  long lVar1;
  ROOM_INDEX_DATA *pRVar2;
  long in_RDI;
  ROOM_INDEX_DATA *oldroom;
  ROOM_INDEX_DATA *room;
  char_data **in_stack_00000098;
  _func_void_char_data_ptr_int *in_stack_000000a0;
  string *in_stack_000000a8;
  string *in_stack_000000b0;
  int in_stack_000000bc;
  CQueue *in_stack_000000c0;
  int *in_stack_000000d0;
  int in_stack_000011bc;
  CHAR_DATA *in_stack_000011c0;
  char *in_stack_000012f0;
  CHAR_DATA *in_stack_000012f8;
  undefined8 in_stack_ffffffffffffff78;
  int vnum_00;
  CHAR_DATA *in_stack_ffffffffffffff80;
  string local_78 [16];
  ROOM_INDEX_DATA *in_stack_ffffffffffffff98;
  CHAR_DATA *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_41;
  CHAR_DATA *in_stack_ffffffffffffffc0;
  
  vnum_00 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  pRVar2 = get_room_index(vnum_00);
  lVar1 = *(long *)(in_RDI + 0xa8);
  if (*(ROOM_INDEX_DATA **)(in_RDI + 0xa8) == pRVar2) {
    apet_at_room(in_stack_000011c0,in_stack_000011bc);
  }
  else {
    walk_to_room(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if ((*(long *)(in_RDI + 0xa8) == lVar1) ||
       (*(long *)(in_RDI + 0xa8) != *(long *)(*(long *)(in_RDI + 0x18) + 0xa8))) {
      if (*(long *)(in_RDI + 0xa8) != *(long *)(*(long *)(in_RDI + 0x18) + 0xa8)) {
        char_from_room(in_stack_ffffffffffffffc0);
        char_to_room(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      do_say(in_stack_000012f8,in_stack_000012f0);
      *(long *)(*(long *)(in_RDI + 0x18) + 0x10) = in_RDI;
      *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_RDI + 0x18);
    }
    else {
      WAIT_STATE(in_stack_ffffffffffffff80,vnum_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                 (allocator<char> *)in_stack_ffffffffffffffa0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                 (allocator<char> *)in_stack_ffffffffffffffa0);
      CQueue::AddToQueue<void(*)(char_data*,int),char_data*&,int&>
                (in_stack_000000c0,in_stack_000000bc,in_stack_000000b0,in_stack_000000a8,
                 in_stack_000000a0,in_stack_00000098,in_stack_000000d0);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
      std::allocator<char>::~allocator(&local_41);
    }
  }
  return;
}

Assistant:

void apet_walk_to_room(CHAR_DATA *ch, int vnum)
{
	ROOM_INDEX_DATA *room = get_room_index(vnum), *oldroom = ch->in_room;

	if (ch->in_room == room)
	{
		apet_at_room(ch, vnum);
		return;
	}

	walk_to_room(ch, room);

	if (ch->in_room == oldroom || ch->in_room != ch->leader->in_room)
	{
		if (ch->in_room != ch->leader->in_room)
		{
			char_from_room(ch);
			char_to_room(ch, ch->leader->in_room);
		}

		do_say(ch, "I can't seem to lead us over there from here.  Try heading back to another part of town?");

		ch->leader->master = ch;
		ch->master = ch->leader;
		return;
	}

	WAIT_STATE(ch->leader, PULSE_VIOLENCE);

	RS.Queue.AddToQueue(2, "apet_walk_to_room", "apet_walk_to_room", apet_walk_to_room, ch, vnum);
}